

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptStringObject::IsConfigurable(JavascriptStringObject *this,PropertyId propertyId)

{
  bool bVar1;
  PropertyQueryFlags PVar2;
  BOOL BVar3;
  uint uVar4;
  
  uVar4 = 0;
  if (propertyId != 0xd1) {
    PVar2 = DynamicObject::HasPropertyQuery
                      (&this->super_DynamicObject,propertyId,(PropertyValueInfo *)0x0);
    if (PVar2 == Property_Found) {
      BVar3 = DynamicObject::IsConfigurable(&this->super_DynamicObject,propertyId);
      return BVar3;
    }
    bVar1 = IsValidIndex(this,propertyId,false);
    uVar4 = (uint)bVar1;
  }
  return uVar4;
}

Assistant:

BOOL JavascriptStringObject::IsConfigurable(PropertyId propertyId)
    {
        if (propertyId == PropertyIds::length)
        {
            return false;
        }

        // From DynamicObject::IsConfigurable we can't tell if the result is from a property or just default
        // value. Call HasProperty to find out.
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, nullptr /*info*/)))
        {
            return DynamicObject::IsConfigurable(propertyId);
        }

        return JavascriptStringObject::IsValidIndex(propertyId, false);
    }